

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# untyped_message.cc
# Opt level: O1

Status __thiscall
google::protobuf::json_internal::UntypedMessage::Decode
          (UntypedMessage *this,CodedInputStream *stream,optional<int> current_group)

{
  byte *pbVar1;
  char *pcVar2;
  long lVar3;
  undefined4 *puVar4;
  bool bVar5;
  uint32_t uVar6;
  int count;
  UntypedMessage *value;
  anon_union_8_2_a3c22f61_for_StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*>_3
  *paVar7;
  ulong uVar8;
  ulong in_RCX;
  int original_buffer_size;
  uint uVar9;
  byte bVar10;
  pair<unsigned_long,_bool> pVar11;
  int32_t field_number;
  vector<int,_std::allocator<int>_> group_stack;
  StatusOr<const_google::protobuf::json_internal::ResolverPool::Message_*> group_desc;
  uint64_t x;
  int local_94;
  CodedInputStream *local_90;
  int *local_88;
  iterator iStack_80;
  int *local_78;
  anon_union_8_1_1246618d_for_StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*>_1
  local_70;
  anon_union_8_2_a3c22f61_for_StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*>_3
  local_68;
  anon_union_8_2_a3c22f61_for_StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*>_3
  local_60;
  raw_hash_set<_2385b75b_> local_58;
  code *local_38;
  
  local_88 = (int *)0x0;
  iStack_80._M_current = (int *)0x0;
  local_78 = (int *)0x0;
  local_38 = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>;
  local_90 = stream;
  do {
    pbVar1 = *(byte **)current_group.super__Optional_base<int,_true,_true>._M_payload.
                       super__Optional_payload_base<int>;
    if (pbVar1 < *(byte **)((long)current_group.super__Optional_base<int,_true,_true>._M_payload.
                                  super__Optional_payload_base<int> + 8)) {
      bVar10 = *pbVar1;
      uVar8 = (ulong)bVar10;
      uVar6 = (uint32_t)bVar10;
      if ((char)bVar10 < '\0') goto LAB_002ddcc7;
      *(byte **)current_group.super__Optional_base<int,_true,_true>._M_payload.
                super__Optional_payload_base<int> = pbVar1 + 1;
    }
    else {
      uVar6 = 0;
LAB_002ddcc7:
      uVar6 = io::CodedInputStream::ReadTagFallback
                        ((CodedInputStream *)
                         current_group.super__Optional_base<int,_true,_true>._M_payload.
                         super__Optional_payload_base<int>,uVar6);
      uVar8 = (ulong)uVar6;
    }
    uVar9 = (uint)uVar8;
    *(uint *)((long)current_group.super__Optional_base<int,_true,_true>._M_payload.
                    super__Optional_payload_base<int> + 0x20) = uVar9;
    if (uVar9 == 0) {
LAB_002dddce:
      this->desc_ = (Message *)0x1;
      bVar10 = 1;
    }
    else {
      local_94 = (int)(uVar8 >> 3);
      uVar9 = uVar9 & 7;
      if ((uVar9 == 4) && (local_88 == iStack_80._M_current)) {
        if ((in_RCX & 0x100000000) == 0) {
          bVar10 = 1;
          MakeEndGroupWithoutGroupError((json_internal *)this,local_94);
        }
        else {
          if (local_94 == (int)in_RCX) goto LAB_002dddce;
          bVar10 = 1;
          MakeEndGroupMismatchError((json_internal *)this,local_94,(int)in_RCX);
        }
        goto LAB_002ddfb7;
      }
      value = (UntypedMessage *)
              ResolverPool::Message::FindField((Message *)local_90->buffer_,local_94);
      if (value == (UntypedMessage *)0x0 || local_88 != iStack_80._M_current) {
        switch(uVar9) {
        case 0:
          pcVar2 = *(char **)current_group.super__Optional_base<int,_true,_true>._M_payload.
                             super__Optional_payload_base<int>;
          if ((pcVar2 < *(char **)((long)current_group.super__Optional_base<int,_true,_true>.
                                         _M_payload.super__Optional_payload_base<int> + 8)) &&
             (-1 < *pcVar2)) {
            paVar7 = (anon_union_8_2_a3c22f61_for_StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*>_3
                      *)(pcVar2 + 1);
LAB_002ddfae:
            *(anon_union_8_2_a3c22f61_for_StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*>_3
              **)current_group.super__Optional_base<int,_true,_true>._M_payload.
                 super__Optional_payload_base<int> = paVar7;
LAB_002ddfb1:
            bVar10 = 0;
          }
          else {
            pVar11 = io::CodedInputStream::ReadVarint64Fallback
                               ((CodedInputStream *)
                                current_group.super__Optional_base<int,_true,_true>._M_payload.
                                super__Optional_payload_base<int>);
            bVar10 = 0;
            if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
              bVar10 = 1;
              MakeUnexpectedEofError();
            }
          }
          break;
        case 1:
          paVar7 = *(anon_union_8_2_a3c22f61_for_StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*>_3
                     **)current_group.super__Optional_base<int,_true,_true>._M_payload.
                        super__Optional_payload_base<int>;
          if (7 < *(int *)((long)current_group.super__Optional_base<int,_true,_true>._M_payload.
                                 super__Optional_payload_base<int> + 8) - (int)paVar7) {
            local_60 = *paVar7;
            paVar7 = paVar7 + 1;
            goto LAB_002ddfae;
          }
          bVar5 = io::CodedInputStream::ReadLittleEndian64Fallback
                            ((CodedInputStream *)
                             current_group.super__Optional_base<int,_true,_true>._M_payload.
                             super__Optional_payload_base<int>,(uint64_t *)&local_60);
          bVar10 = 0;
          if (!bVar5) {
            bVar10 = 1;
            MakeUnexpectedEofError();
          }
          break;
        case 2:
          pbVar1 = *(byte **)current_group.super__Optional_base<int,_true,_true>._M_payload.
                             super__Optional_payload_base<int>;
          if (pbVar1 < *(byte **)((long)current_group.super__Optional_base<int,_true,_true>.
                                        _M_payload.super__Optional_payload_base<int> + 8)) {
            bVar10 = *pbVar1;
            uVar8 = (ulong)bVar10;
            uVar6 = (uint32_t)bVar10;
            if ((char)bVar10 < '\0') goto LAB_002de055;
            *(byte **)current_group.super__Optional_base<int,_true,_true>._M_payload.
                      super__Optional_payload_base<int> = pbVar1 + 1;
            bVar5 = true;
          }
          else {
            uVar6 = 0;
LAB_002de055:
            uVar8 = io::CodedInputStream::ReadVarint32Fallback
                              ((CodedInputStream *)
                               current_group.super__Optional_base<int,_true,_true>._M_payload.
                               super__Optional_payload_base<int>,uVar6);
            bVar5 = -1 < (long)uVar8;
          }
          if (bVar5) {
            bVar10 = 0;
            count = (int)uVar8;
            if (-1 < count) {
              original_buffer_size =
                   *(int *)((long)current_group.super__Optional_base<int,_true,_true>._M_payload.
                                  super__Optional_payload_base<int> + 8) -
                   (int)*(long *)current_group.super__Optional_base<int,_true,_true>._M_payload.
                                 super__Optional_payload_base<int>;
              if (original_buffer_size < count) {
                io::CodedInputStream::SkipFallback
                          ((CodedInputStream *)
                           current_group.super__Optional_base<int,_true,_true>._M_payload.
                           super__Optional_payload_base<int>,count,original_buffer_size);
              }
              else {
                *(ulong *)current_group.super__Optional_base<int,_true,_true>._M_payload.
                          super__Optional_payload_base<int> =
                     *(long *)current_group.super__Optional_base<int,_true,_true>._M_payload.
                              super__Optional_payload_base<int> + (uVar8 & 0xffffffff);
              }
            }
          }
          else {
            bVar10 = 1;
            MakeUnexpectedEofError();
          }
          break;
        case 3:
          if (iStack_80._M_current != local_78) {
            *iStack_80._M_current = local_94;
            iStack_80._M_current = iStack_80._M_current + 1;
            goto LAB_002ddfb1;
          }
          bVar10 = 0;
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&local_88,iStack_80,&local_94);
          break;
        case 4:
          if (local_88 == iStack_80._M_current) {
            bVar10 = 1;
            MakeEndGroupWithoutGroupError((json_internal *)this,local_94);
          }
          else {
            if (local_94 == iStack_80._M_current[-1]) {
              iStack_80._M_current = iStack_80._M_current + -1;
              goto LAB_002ddfb1;
            }
            bVar10 = 1;
            MakeEndGroupMismatchError((json_internal *)this,local_94,iStack_80._M_current[-1]);
          }
          break;
        case 5:
          puVar4 = *(undefined4 **)
                    current_group.super__Optional_base<int,_true,_true>._M_payload.
                    super__Optional_payload_base<int>;
          if (3 < *(int *)((long)current_group.super__Optional_base<int,_true,_true>._M_payload.
                                 super__Optional_payload_base<int> + 8) - (int)puVar4) {
            local_60._0_4_ = *puVar4;
            paVar7 = (anon_union_8_2_a3c22f61_for_StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*>_3
                      *)(puVar4 + 1);
            goto LAB_002ddfae;
          }
          bVar5 = io::CodedInputStream::ReadLittleEndian32Fallback
                            ((CodedInputStream *)
                             current_group.super__Optional_base<int,_true,_true>._M_payload.
                             super__Optional_payload_base<int>,(uint32_t *)&local_60);
          bVar10 = 0;
          if (!bVar5) {
            bVar10 = 1;
            MakeUnexpectedEofError();
          }
          break;
        default:
          goto switchD_002ddd41_default;
        }
        goto LAB_002ddfb7;
      }
      switch(uVar9) {
      case 0:
        DecodeVarint(this,local_90,
                     (Field *)current_group.super__Optional_base<int,_true,_true>._M_payload.
                              super__Optional_payload_base<int>);
        break;
      case 1:
        Decode64Bit(this,local_90,
                    (Field *)current_group.super__Optional_base<int,_true,_true>._M_payload.
                             super__Optional_payload_base<int>);
        break;
      case 2:
        DecodeDelimited(this,local_90,
                        (Field *)current_group.super__Optional_base<int,_true,_true>._M_payload.
                                 super__Optional_payload_base<int>);
        break;
      case 3:
        lVar3 = (value->fields_).super_raw_hash_map<_2385b75b_>.super_raw_hash_set<_2385b75b_>.
                settings_.
                super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::variant<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool,_std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<google::protobuf::json_internal::UntypedMessage,_std::allocator<google::protobuf::json_internal::UntypedMessage>_>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.
                value.capacity_;
        if (*(int *)(lVar3 + 0x48) != 10) {
          bVar10 = 1;
          MakeFieldNotGroupError((json_internal *)this,*(int *)(lVar3 + 0x50));
          goto LAB_002ddfb7;
        }
        ResolverPool::Field::MessageType((Field *)&local_70.status_);
        this->desc_ = (Message *)local_70;
        if (((ulong)local_70 & 1) == 0) {
          LOCK();
          *(int *)local_70 = *(int *)local_70 + 1;
          UNLOCK();
        }
        bVar10 = 1;
        if (this->desc_ == (Message *)0x1) {
          if (local_70 !=
              (anon_union_8_1_1246618d_for_StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*>_1
               )0x1) {
            absl::lts_20240722::internal_statusor::Helper::Crash(&local_70.status_);
            goto switchD_002ddd41_caseD_4;
          }
          local_60 = local_68;
          local_58.settings_.
          super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::variant<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool,_std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<google::protobuf::json_internal::UntypedMessage,_std::allocator<google::protobuf::json_internal::UntypedMessage>_>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.
          capacity_ = 0;
          local_58.settings_.
          super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::variant<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool,_std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<google::protobuf::json_internal::UntypedMessage,_std::allocator<google::protobuf::json_internal::UntypedMessage>_>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.
          size_ = 0;
          local_58.settings_.
          super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::variant<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool,_std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<google::protobuf::json_internal::UntypedMessage,_std::allocator<google::protobuf::json_internal::UntypedMessage>_>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.
          heap_or_soo_.heap.control = (ctrl_t *)local_38;
          Decode(this,(CodedInputStream *)&local_60,current_group);
          bVar10 = 1;
          if (this->desc_ == (Message *)0x1) {
            InsertField<google::protobuf::json_internal::UntypedMessage>
                      (this,(Field *)local_90,value);
            bVar10 = (this->desc_ == (Message *)0x1) * '\x04' + 1;
          }
          absl::lts_20240722::container_internal::raw_hash_set<$2385b75b$>::~raw_hash_set(&local_58)
          ;
        }
        absl::lts_20240722::internal_statusor::
        StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*>::~StatusOrData
                  ((StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*> *)
                   &local_70.status_);
        if (bVar10 != 5) goto LAB_002ddfb7;
        goto LAB_002ddf0b;
      case 4:
switchD_002ddd41_caseD_4:
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_60,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/json/internal/untyped_message.cc"
                   ,0x134);
        absl::lts_20240722::log_internal::LogMessage::operator<<
                  ((LogMessage *)&local_60,(char (*) [12])"unreachable");
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_60);
      case 5:
        Decode32Bit(this,local_90,
                    (Field *)current_group.super__Optional_base<int,_true,_true>._M_payload.
                             super__Optional_payload_base<int>);
        break;
      default:
switchD_002ddd41_default:
        bVar10 = 1;
        MakeUnknownWireTypeError((json_internal *)this,uVar9);
        goto LAB_002ddfb7;
      }
      bVar10 = 1;
      if (this->desc_ == (Message *)0x1) {
LAB_002ddf0b:
        bVar10 = 0;
      }
    }
LAB_002ddfb7:
    if ((bVar10 & 5) != 0) {
      if (local_88 != (int *)0x0) {
        operator_delete(local_88,(long)local_78 - (long)local_88);
      }
      return (Status)(uintptr_t)this;
    }
  } while( true );
}

Assistant:

absl::Status UntypedMessage::Decode(io::CodedInputStream& stream,
                                    absl::optional<int32_t> current_group) {
  std::vector<int32_t> group_stack;
  while (true) {
    uint32_t tag = stream.ReadTag();
    if (tag == 0) {
      return absl::OkStatus();
    }

    int32_t field_number = tag >> 3;
    int32_t wire_type = tag & 7;

    // EGROUP markers can show up as "unknown fields", so we need to handle them
    // before we even do field lookup. Being inside of a group behaves as if a
    // special field has been added to the message.
    if (wire_type == WireFormatLite::WIRETYPE_END_GROUP &&
        group_stack.empty()) {
      if (!current_group.has_value()) {
        return MakeEndGroupWithoutGroupError(field_number);
      }
      if (field_number != *current_group) {
        return MakeEndGroupMismatchError(field_number, *current_group);
      }
      return absl::OkStatus();
    }

    const auto* field = desc_->FindField(field_number);
    if (!group_stack.empty() || field == nullptr) {
      // Skip unknown field. If the group-stack is non-empty, we are in the
      // process of working through an unknown group.
      switch (wire_type) {
        case WireFormatLite::WIRETYPE_VARINT: {
          uint64_t x;
          if (!stream.ReadVarint64(&x)) {
            return MakeUnexpectedEofError();
          }
          continue;
        }
        case WireFormatLite::WIRETYPE_FIXED64: {
          uint64_t x;
          if (!stream.ReadLittleEndian64(&x)) {
            return MakeUnexpectedEofError();
          }
          continue;
        }
        case WireFormatLite::WIRETYPE_FIXED32: {
          uint32_t x;
          if (!stream.ReadLittleEndian32(&x)) {
            return MakeUnexpectedEofError();
          }
          continue;
        }
        case WireFormatLite::WIRETYPE_LENGTH_DELIMITED: {
          uint32_t x;
          if (!stream.ReadVarint32(&x)) {
            return MakeUnexpectedEofError();
          }
          stream.Skip(x);
          continue;
        }
        case WireFormatLite::WIRETYPE_START_GROUP: {
          group_stack.push_back(field_number);
          continue;
        }
        case WireFormatLite::WIRETYPE_END_GROUP: {
          if (group_stack.empty()) {
            return MakeEndGroupWithoutGroupError(field_number);
          }
          if (field_number != group_stack.back()) {
            return MakeEndGroupMismatchError(field_number, group_stack.back());
          }
          group_stack.pop_back();
          continue;
        }
        default:
          return MakeUnknownWireTypeError(wire_type);
      }
    }
    switch (wire_type) {
      case WireFormatLite::WIRETYPE_VARINT:
        RETURN_IF_ERROR(DecodeVarint(stream, *field));
        break;
      case WireFormatLite::WIRETYPE_FIXED64:
        RETURN_IF_ERROR(Decode64Bit(stream, *field));
        break;
      case WireFormatLite::WIRETYPE_FIXED32:
        RETURN_IF_ERROR(Decode32Bit(stream, *field));
        break;
      case WireFormatLite::WIRETYPE_LENGTH_DELIMITED:
        RETURN_IF_ERROR(DecodeDelimited(stream, *field));
        break;
      case WireFormatLite::WIRETYPE_START_GROUP: {
        if (field->proto().kind() != Field::TYPE_GROUP) {
          return MakeFieldNotGroupError(field->proto().number());
        }
        auto group_desc = field->MessageType();
        RETURN_IF_ERROR(group_desc.status());

        UntypedMessage group(*group_desc);
        RETURN_IF_ERROR(group.Decode(stream, field_number));
        RETURN_IF_ERROR(InsertField(*field, std::move(group)));
        break;
      }
      case WireFormatLite::WIRETYPE_END_GROUP:
        ABSL_LOG(FATAL) << "unreachable";
        break;
      default:
        return MakeUnknownWireTypeError(wire_type);
    }
  }

  return absl::OkStatus();
}